

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O1

int sprkStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  long *plVar1;
  uint uVar2;
  ARKodeSPRKTable pAVar3;
  int iVar4;
  ARKODE_SPRKMethodID id;
  
  plVar1 = (long *)ark_mem->step_mem;
  if (plVar1 == (long *)0x0) {
    arkProcessError(ark_mem,-0x15,0x32b,"sprkStep_Init",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"Time step module memory is NULL.");
    iVar4 = -0x15;
  }
  else {
    iVar4 = 0;
    if (init_type != 1) {
      if ((init_type == 0) && (*plVar1 == 0)) {
        uVar2 = (int)plVar1[1] - 1;
        if (uVar2 < 10) {
          id = *(ARKODE_SPRKMethodID *)(&DAT_0018410c + (ulong)uVar2 * 4);
        }
        else {
          arkProcessError(ark_mem,99,0x196,"sprkStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                          ,"No SPRK method at requested order, using q=4.");
          id = ARKODE_SPRK_MCLACHLAN_4_4;
        }
        pAVar3 = ARKodeSPRKTable_Load(id);
        *plVar1 = (long)pAVar3;
      }
      iVar4 = *(int *)*plVar1;
      if ((iVar4 < 2) || (ark_mem->interp_degree < iVar4)) {
        if ((iVar4 == 1) && (1 < ark_mem->interp_degree)) {
          ark_mem->interp_degree = 1;
        }
      }
      else {
        ark_mem->interp_degree = iVar4 + -1;
      }
      iVar4 = 0;
      if (ark_mem->use_compensated_sums != 0) {
        N_VConst(0,plVar1[3]);
      }
    }
  }
  return iVar4;
}

Assistant:

int sprkStep_Init(ARKodeMem ark_mem, SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                  int init_type)
{
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if reset */
  if (init_type == RESET_INIT) { return (ARK_SUCCESS); }

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT)
  {
    if (!step_mem->method)
    {
      switch (step_mem->q)
      {
      case 1:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_1);
        break;
      case 2:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_2);
        break;
      case 3:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_3);
        break;
      case 4:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      case 5:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_5);
        break;
      case 6:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_6);
        break;
      case 7:
      case 8:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_8);
        break;
      case 9:
      case 10:
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_10);
        break;
      default:
        arkProcessError(ark_mem, ARK_WARNING, __LINE__, __func__, __FILE__,
                        "No SPRK method at requested order, using q=4.");
        step_mem->method = ARKodeSPRKTable_Load(SPRKSTEP_DEFAULT_4);
        break;
      }
    }
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->method->q > 1 &&
      ark_mem->interp_degree > (step_mem->method->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->method->q - 1;
  }
  else if (step_mem->method->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  /* Zero yerr for compensated summation */
  if (ark_mem->use_compensated_sums) { N_VConst(ZERO, step_mem->yerr); }

  return (ARK_SUCCESS);
}